

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void test_real(void)

{
  double obj [2];
  double ub [2];
  double lb [2];
  double rowentries1 [2];
  void *soplex2;
  int result;
  double primal [2];
  double lhs [1];
  double colentries2 [1];
  double colentries1 [1];
  double infty;
  void *soplex;
  undefined8 local_88;
  undefined8 local_80;
  ulong local_78;
  ulong local_70;
  undefined8 local_68;
  ulong local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_3c;
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  ulong local_10;
  undefined8 local_8;
  
  local_8 = SoPlex_create();
  local_10 = 0x444b1ae4d6e2ef50;
  local_18 = 0xbff0000000000000;
  local_20 = 0x3ff0000000000000;
  local_28 = 0xc024000000000000;
  memset(local_38,0,0x10);
  SoPlex_setIntParam(local_8,0,0xffffffff);
  SoPlex_addColReal(0x3ff0000000000000,local_8,&local_18,1);
  SoPlex_addColReal(0x3ff0000000000000,local_10 ^ 0x8000000000000000,local_10,local_8,&local_20,1);
  SoPlex_changeLhsReal(local_8,&local_28,1);
  local_3c = SoPlex_optimize(local_8);
  SoPlex_getPrimalReal(local_8,local_38,2);
  SoPlex_free(local_8);
  local_48 = SoPlex_create();
  local_58 = 0xbff0000000000000;
  local_50 = 0x3ff0000000000000;
  local_68 = 0;
  local_60 = local_10 ^ 0x8000000000000000;
  local_78 = local_10;
  local_70 = local_10;
  local_88 = 0x3ff0000000000000;
  local_80 = 0x3ff0000000000000;
  SoPlex_setIntParam(local_48,0,0xffffffff);
  SoPlex_addRowReal(0xc024000000000000,local_10,local_48,&local_58,2);
  SoPlex_changeBoundsReal(local_48,&local_68,&local_78,2);
  SoPlex_changeObjReal(local_48,&local_88,2);
  local_3c = SoPlex_optimize(local_48);
  SoPlex_getPrimalReal(local_48,local_38,2);
  SoPlex_free(local_48);
  return;
}

Assistant:

void test_real(void)
{
   /* create LP via columns */

   void *soplex = SoPlex_create();
   double infty = 10e+20;
   double colentries1[] = {-1.0};
   double colentries2[] = {1.0};
   double lhs[] = {-10.0};
   double primal[] = {0.0,0.0};

   /* minimize */
   SoPlex_setIntParam(soplex, 0, -1);

   /* add columns */
   SoPlex_addColReal(soplex, colentries1, 1, 1, 1.0, 0.0, infty);
   SoPlex_addColReal(soplex, colentries2, 1, 1, 1.0, -infty, infty);
   assert(SoPlex_numRows(soplex) == 1);
   assert(SoPlex_numCols(soplex) == 2);

   /* set lhs of constraint */
   SoPlex_changeLhsReal(soplex, lhs, 1);

   /* optimize and get solution and objective value */
   int result = SoPlex_optimize(soplex);
   assert(result == 1);
   UNUSED(result); /* add this to avoid unused variable warining */
   SoPlex_getPrimalReal(soplex, primal, 2);
   assert(primal[0] == 0.0 && primal[1] == -10.0);
   assert(SoPlex_objValueReal(soplex) == -10.0);

	SoPlex_free(soplex);

   /* create LP via rows */

   void *soplex2 = SoPlex_create();
   double rowentries1[] = {-1.0, 1.0};
   double lb[] = {0.0, -infty};
   double ub[] = {infty, infty};
   double obj[] = {1.0, 1.0};

   /* minimize */
   SoPlex_setIntParam(soplex2, 0, -1);

   /* add row */
   SoPlex_addRowReal(soplex2, rowentries1, 2, 2, -10.0, infty);

   /* add variable bounds */
   SoPlex_changeBoundsReal(soplex2, lb, ub, 2);
   assert(SoPlex_numRows(soplex2) == 1);
   assert(SoPlex_numCols(soplex2) == 2);

   /* add objective */
   SoPlex_changeObjReal(soplex2, obj, 2);

   /* optimize and get solution and objective value */
   result = SoPlex_optimize(soplex2);
   assert(result == 1);
   SoPlex_getPrimalReal(soplex2, primal, 2);
   assert(primal[0] == 0.0 && primal[1] == -10.0);
   assert(SoPlex_objValueReal(soplex2) == -10.0);

	SoPlex_free(soplex2);
}